

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemImpl.cpp
# Opt level: O0

void efsw::Platform::System::maxFD(void)

{
  undefined1 local_18 [8];
  rlimit limit;
  
  if (!maxFD::maxed) {
    getrlimit(RLIMIT_NOFILE,(rlimit *)local_18);
    local_18 = (undefined1  [8])limit.rlim_cur;
    setrlimit(RLIMIT_NOFILE,(rlimit *)local_18);
    getrlimit(RLIMIT_NOFILE,(rlimit *)local_18);
    maxFD::maxed = true;
  }
  return;
}

Assistant:

void System::maxFD() {
	static bool maxed = false;

	if ( !maxed ) {
		struct rlimit limit;
		getrlimit( RLIMIT_NOFILE, &limit );
		limit.rlim_cur = limit.rlim_max;
		setrlimit( RLIMIT_NOFILE, &limit );

		getrlimit( RLIMIT_NOFILE, &limit );

		efDEBUG( "File descriptor limit %ld\n", limit.rlim_cur );

		maxed = true;
	}
}